

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastLut(Gia_Man_t *pNew,word Truth,int *pFans,int nFans,int nOuts,Vec_Int_t *vRes)

{
  int iVar1;
  Vec_Int_t *vMemory;
  word wVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  Vec_Int_t vLeaves;
  word local_50;
  Gia_Man_t *local_48;
  Vec_Int_t local_40;
  
  local_50 = Truth;
  local_48 = pNew;
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0;
  vMemory->nSize = 0;
  vMemory->pArray = (int *)0x0;
  vRes->nSize = 0;
  local_40.nCap = nFans;
  local_40.nSize = nFans;
  local_40.pArray = pFans;
  if (nOuts != 1) {
    __assert_fail("nOuts == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                  ,0x2d8,"void Wlc_BlastLut(Gia_Man_t *, word, int *, int, int, Vec_Int_t *)");
  }
  if (nFans < 6) {
    if (nFans < 0) {
      __assert_fail("nVars >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x489,"word Abc_Tt6Stretch(word, int)");
    }
    uVar3 = ((uint)Truth & 1) * 3;
    if (nFans != 0) {
      uVar3 = (uint)Truth;
    }
    bVar7 = 1 < (uint)nFans;
    iVar1 = 1;
    if (bVar7) {
      iVar1 = nFans;
    }
    wVar2 = (ulong)(uVar3 & 3) * 5;
    if (bVar7) {
      wVar2 = Truth;
    }
    iVar4 = 2;
    if (bVar7) {
      iVar4 = iVar1;
    }
    uVar3 = (uint)wVar2 & 0xf;
    uVar6 = (ulong)(uVar3 << 4 | uVar3);
    if (iVar4 != 2) {
      uVar6 = wVar2;
    }
    iVar1 = 3;
    if (iVar4 != 2) {
      iVar1 = iVar4;
    }
    uVar5 = (ulong)(uint)((int)(uVar6 & 0xff) << 8) | uVar6 & 0xff;
    if (iVar1 != 3) {
      uVar5 = uVar6;
    }
    uVar6 = (ulong)((uint)uVar5 << 0x10 | (uint)uVar5 & 0xffff);
    if (1 < iVar1 - 3U) {
      uVar6 = uVar5;
    }
    local_50 = uVar6 << 0x20 | uVar6 & 0xffffffff;
  }
  iVar1 = Kit_TruthToGia(local_48,(uint *)&local_50,nFans,vMemory,&local_40,1);
  Vec_IntPush(vRes,iVar1);
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
    vMemory->pArray = (int *)0x0;
  }
  free(vMemory);
  return;
}

Assistant:

void Wlc_BlastLut( Gia_Man_t * pNew, word Truth, int * pFans, int nFans, int nOuts, Vec_Int_t * vRes )
{
    extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
    Vec_Int_t * vMemory = Vec_IntAlloc( 0 );
    Vec_Int_t vLeaves = { nFans, nFans, pFans };
    int iLit;
    Vec_IntClear( vRes );
    assert( nOuts == 1 );
    if ( nFans < 6 )
        Truth = Abc_Tt6Stretch( Truth, nFans );
    iLit = Kit_TruthToGia( pNew, (unsigned *)&Truth, nFans, vMemory, &vLeaves, 1 );
    Vec_IntPush( vRes, iLit );
    Vec_IntFree( vMemory );
}